

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_msg.c
# Opt level: O0

void ssl_buffering_free_slot(mbedtls_ssl_context *ssl,uint8_t slot)

{
  mbedtls_ssl_handshake_params *pmVar1;
  mbedtls_ssl_hs_buffer *__s;
  mbedtls_ssl_hs_buffer *hs_buf;
  mbedtls_ssl_handshake_params *hs;
  uint8_t slot_local;
  mbedtls_ssl_context *ssl_local;
  
  pmVar1 = ssl->handshake;
  __s = (pmVar1->buffering).hs + slot;
  if ((slot < 4) &&
     ((undefined1  [24])((undefined1  [24])*__s & (undefined1  [24])0x1) == (undefined1  [24])0x1))
  {
    (pmVar1->buffering).total_bytes_buffered =
         (pmVar1->buffering).total_bytes_buffered - __s->data_len;
    mbedtls_zeroize_and_free(__s->data,__s->data_len);
    memset(__s,0,0x18);
  }
  return;
}

Assistant:

static void ssl_buffering_free_slot(mbedtls_ssl_context *ssl,
                                    uint8_t slot)
{
    mbedtls_ssl_handshake_params * const hs = ssl->handshake;
    mbedtls_ssl_hs_buffer * const hs_buf = &hs->buffering.hs[slot];

    if (slot >= MBEDTLS_SSL_MAX_BUFFERED_HS) {
        return;
    }

    if (hs_buf->is_valid == 1) {
        hs->buffering.total_bytes_buffered -= hs_buf->data_len;
        mbedtls_zeroize_and_free(hs_buf->data, hs_buf->data_len);
        memset(hs_buf, 0, sizeof(mbedtls_ssl_hs_buffer));
    }
}